

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.cpp
# Opt level: O0

entry * libtorrent::dht::anon_unknown_6::save_nodes
                  (entry *__return_storage_ptr__,
                  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                  *nodes)

{
  bool bVar1;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this;
  reference e;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  out;
  string node;
  basic_endpoint<boost::asio::ip::udp> *ep;
  const_iterator __end2;
  const_iterator __begin2;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  *__range2;
  list_type *list;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  *nodes_local;
  entry *ret;
  
  entry::entry(__return_storage_ptr__,list_t);
  this = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
         entry::list(__return_storage_ptr__);
  __end2 = ::std::
           vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ::begin(nodes);
  ep = (basic_endpoint<boost::asio::ip::udp> *)
       ::std::
       vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
       ::end(nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                                     *)&ep), bVar1) {
    e = __gnu_cxx::
        __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
        ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)&out);
    ::std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::back_insert_iterator
              (&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    libtorrent::aux::
    write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::back_insert_iterator<std::__cxx11::string>&>
              (e,&local_80);
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::__cxx11::string&>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    ::std::__cxx11::string::~string((string *)&out);
    __gnu_cxx::
    __normal_iterator<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

entry save_nodes(std::vector<udp::endpoint> const& nodes)
	{
		entry ret(entry::list_t);
		entry::list_type& list = ret.list();
		for (auto const& ep : nodes)
		{
			std::string node;
			std::back_insert_iterator<std::string> out(node);
			aux::write_endpoint(ep, out);
			list.emplace_back(node);
		}
		return ret;
	}